

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unescape.cc
# Opt level: O1

uint32_t re2c::unesc_oct(char *s,char *s_end)

{
  uint32_t uVar1;
  char *pcVar2;
  
  uVar1 = 0;
  for (pcVar2 = s + 1; pcVar2 != s_end; pcVar2 = pcVar2 + 1) {
    uVar1 = (uint)(byte)(*pcVar2 - 0x30) + uVar1 * 8;
  }
  return uVar1;
}

Assistant:

uint32_t unesc_oct (const char * s, const char * s_end)
{
	uint32_t n = 0;
	for (++s; s != s_end; ++s)
	{
		n <<= 3;
		n += static_cast<uint8_t> (*s - '0');
	}
	return n;
}